

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O2

unique_ptr<wabt::InvokeAction,_std::default_delete<wabt::InvokeAction>_> __thiscall
wabt::MakeUnique<wabt::InvokeAction,wabt::Location&>(wabt *this,Location *args)

{
  InvokeAction *this_00;
  
  this_00 = (InvokeAction *)operator_new(0xb0);
  InvokeAction::InvokeAction(this_00,args);
  *(InvokeAction **)this = this_00;
  return (__uniq_ptr_data<wabt::InvokeAction,_std::default_delete<wabt::InvokeAction>,_true,_true>)
         (__uniq_ptr_data<wabt::InvokeAction,_std::default_delete<wabt::InvokeAction>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}